

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Vdbe * sqlite3VdbeCreate(sqlite3 *db)

{
  Vdbe *pVVar1;
  Vdbe *pVVar2;
  
  pVVar2 = (Vdbe *)sqlite3DbMallocZero(db,0x110);
  if (pVVar2 != (Vdbe *)0x0) {
    pVVar2->db = db;
    pVVar1 = db->pVdbe;
    if (pVVar1 != (Vdbe *)0x0) {
      pVVar1->pPrev = pVVar2;
    }
    pVVar2->pNext = pVVar1;
    pVVar2->pPrev = (Vdbe *)0x0;
    db->pVdbe = pVVar2;
    pVVar2->magic = 0x26bceaa5;
  }
  return pVVar2;
}

Assistant:

SQLITE_PRIVATE Vdbe *sqlite3VdbeCreate(sqlite3 *db){
  Vdbe *p;
  p = sqlite3DbMallocZero(db, sizeof(Vdbe) );
  if( p==0 ) return 0;
  p->db = db;
  if( db->pVdbe ){
    db->pVdbe->pPrev = p;
  }
  p->pNext = db->pVdbe;
  p->pPrev = 0;
  db->pVdbe = p;
  p->magic = VDBE_MAGIC_INIT;
  return p;
}